

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contour.cpp
# Opt level: O3

int __thiscall msdfgen::Contour::winding(Contour *this)

{
  EdgeHolder *this_00;
  EdgeHolder *pEVar1;
  int iVar2;
  long lVar3;
  EdgeSegment *pEVar4;
  long lVar5;
  pointer this_01;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double dVar6;
  double extraout_XMM0_Qa_07;
  double in_XMM1_Qa;
  double dVar7;
  double dVar8;
  
  this_00 = (this->edges).
            super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar1 = (this->edges).
           super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 == pEVar1) {
    iVar2 = 0;
  }
  else {
    lVar3 = (long)pEVar1 - (long)this_00;
    lVar5 = lVar3 >> 3;
    if (lVar5 == 2) {
      pEVar4 = EdgeHolder::operator->(this_00);
      (*pEVar4->_vptr_EdgeSegment[3])(0,pEVar4);
      dVar8 = in_XMM1_Qa;
      pEVar4 = EdgeHolder::operator->
                         ((this->edges).
                          super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      (*pEVar4->_vptr_EdgeSegment[3])(0x3fe0000000000000,pEVar4);
      dVar6 = dVar8;
      pEVar4 = EdgeHolder::operator->
                         ((this->edges).
                          super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
      (*pEVar4->_vptr_EdgeSegment[3])(0,pEVar4);
      dVar7 = dVar6;
      pEVar4 = EdgeHolder::operator->
                         ((this->edges).
                          super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
      (*pEVar4->_vptr_EdgeSegment[3])(0x3fe0000000000000,pEVar4);
      dVar8 = (in_XMM1_Qa + dVar7) * (extraout_XMM0_Qa_02 - extraout_XMM0_Qa_05) +
              (dVar6 + dVar7) * (extraout_XMM0_Qa_05 - extraout_XMM0_Qa_04) +
              (dVar8 + dVar6) * (extraout_XMM0_Qa_04 - extraout_XMM0_Qa_03) +
              (in_XMM1_Qa + dVar8) * (extraout_XMM0_Qa_03 - extraout_XMM0_Qa_02) + 0.0;
    }
    else if (lVar5 == 1) {
      pEVar4 = EdgeHolder::operator->(this_00);
      (*pEVar4->_vptr_EdgeSegment[3])(0,pEVar4);
      dVar8 = in_XMM1_Qa;
      pEVar4 = EdgeHolder::operator->
                         ((this->edges).
                          super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      (*pEVar4->_vptr_EdgeSegment[3])(0x3fd5555555555555,pEVar4);
      dVar6 = dVar8;
      pEVar4 = EdgeHolder::operator->
                         ((this->edges).
                          super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      (*pEVar4->_vptr_EdgeSegment[3])(0x3fe5555555555555,pEVar4);
      dVar8 = (in_XMM1_Qa + dVar6) * (extraout_XMM0_Qa - extraout_XMM0_Qa_01) +
              (dVar8 + dVar6) * (extraout_XMM0_Qa_01 - extraout_XMM0_Qa_00) +
              (in_XMM1_Qa + dVar8) * (extraout_XMM0_Qa_00 - extraout_XMM0_Qa) + 0.0;
    }
    else {
      pEVar4 = EdgeHolder::operator->((EdgeHolder *)((long)this_00 + lVar3 + -8));
      (*pEVar4->_vptr_EdgeSegment[3])(0,pEVar4);
      dVar8 = 0.0;
      dVar6 = extraout_XMM0_Qa_06;
      for (this_01 = (this->edges).
                     super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          this_01 !=
          (this->edges).
          super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>._M_impl.
          super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
        dVar7 = in_XMM1_Qa;
        pEVar4 = EdgeHolder::operator->(this_01);
        (*pEVar4->_vptr_EdgeSegment[3])(0,pEVar4);
        dVar8 = dVar8 + (in_XMM1_Qa + dVar7) * (extraout_XMM0_Qa_07 - dVar6);
        dVar6 = extraout_XMM0_Qa_07;
        in_XMM1_Qa = dVar7;
      }
    }
    iVar2 = (uint)(0.0 < dVar8) - (uint)(dVar8 < 0.0);
  }
  return iVar2;
}

Assistant:

int Contour::winding() const {
    if (edges.empty())
        return 0;
    double total = 0;
    if (edges.size() == 1) {
        Point2 a = edges[0]->point(0), b = edges[0]->point(1/3.), c = edges[0]->point(2/3.);
        total += shoelace(a, b);
        total += shoelace(b, c);
        total += shoelace(c, a);
    } else if (edges.size() == 2) {
        Point2 a = edges[0]->point(0), b = edges[0]->point(.5), c = edges[1]->point(0), d = edges[1]->point(.5);
        total += shoelace(a, b);
        total += shoelace(b, c);
        total += shoelace(c, d);
        total += shoelace(d, a);
    } else {
        Point2 prev = edges[edges.size()-1]->point(0);
        for (std::vector<EdgeHolder>::const_iterator edge = edges.begin(); edge != edges.end(); ++edge) {
            Point2 cur = (*edge)->point(0);
            total += shoelace(prev, cur);
            prev = cur;
        }
    }
    return sign(total);
}